

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int PrintAction(action *ap,FILE *fp,int indent)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  rule *rp;
  
  uVar4 = CONCAT44(in_register_00000014,indent);
  iVar5 = 1;
  switch(ap->type) {
  case SHIFT:
    pcVar3 = ap->sp->name;
    uVar7 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar6 = "%*s shift        %-7d";
    break;
  case ACCEPT:
    pcVar3 = ap->sp->name;
    pcVar6 = "%*s accept";
    goto LAB_0010a21a;
  case REDUCE:
    rp = (ap->x).rp;
    pcVar3 = ap->sp->name;
    uVar1 = rp->iRule;
    pcVar6 = "%*s reduce       %-7d";
    goto LAB_0010a23e;
  case ERROR:
    pcVar3 = ap->sp->name;
    pcVar6 = "%*s error";
LAB_0010a21a:
    bVar2 = false;
    fprintf((FILE *)fp,pcVar6,uVar4,pcVar3);
    goto LAB_0010a291;
  case SSCONFLICT:
    pcVar3 = ap->sp->name;
    uVar7 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar6 = "%*s shift        %-7d ** Parsing conflict **";
    break;
  case SRCONFLICT:
  case RRCONFLICT:
    pcVar3 = ap->sp->name;
    uVar7 = (ulong)(uint)((ap->x).rp)->iRule;
    pcVar6 = "%*s reduce       %-7d ** Parsing conflict **";
    break;
  case SH_RESOLVED:
    if (showPrecedenceConflict == 0) goto switchD_0010a172_caseD_9;
    pcVar3 = ap->sp->name;
    uVar7 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar6 = "%*s shift        %-7d -- dropped by precedence";
    break;
  case RD_RESOLVED:
    if (showPrecedenceConflict == 0) goto switchD_0010a172_caseD_9;
    pcVar3 = ap->sp->name;
    uVar7 = (ulong)(uint)((ap->x).rp)->iRule;
    pcVar6 = "%*s reduce %-7d -- dropped by precedence";
    break;
  case NOT_USED:
switchD_0010a172_caseD_9:
    iVar5 = 0;
    bVar2 = true;
    goto LAB_0010a291;
  case SHIFTREDUCE:
    rp = (ap->x).rp;
    pcVar3 = ap->sp->name;
    uVar1 = rp->iRule;
    pcVar6 = "%*s shift-reduce %-7d";
LAB_0010a23e:
    bVar2 = false;
    fprintf((FILE *)fp,pcVar6,uVar4,pcVar3,(ulong)uVar1);
    RulePrint(fp,rp,-1);
    goto LAB_0010a291;
  default:
    bVar2 = false;
    goto LAB_0010a291;
  }
  bVar2 = false;
  fprintf((FILE *)fp,pcVar6,uVar4,pcVar3,uVar7);
LAB_0010a291:
  if ((!bVar2) && (ap->spOpt != (symbol *)0x0)) {
    fprintf((FILE *)fp,"  /* because %s==%s */",ap->sp->name,ap->spOpt->name);
  }
  return iVar5;
}

Assistant:

int PrintAction(
  struct action *ap,          /* The action to print */
  FILE *fp,                   /* Print the action here */
  int indent                  /* Indent by this amount */
){
  int result = 1;
  switch( ap->type ){
    case SHIFT: {
      struct state *stp = ap->x.stp;
      fprintf(fp,"%*s shift        %-7d",indent,ap->sp->name,stp->statenum);
      break;
    }
    case REDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s reduce       %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case SHIFTREDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s shift-reduce %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case ACCEPT:
      fprintf(fp,"%*s accept",indent,ap->sp->name);
      break;
    case ERROR:
      fprintf(fp,"%*s error",indent,ap->sp->name);
      break;
    case SRCONFLICT:
    case RRCONFLICT:
      fprintf(fp,"%*s reduce       %-7d ** Parsing conflict **",
        indent,ap->sp->name,ap->x.rp->iRule);
      break;
    case SSCONFLICT:
      fprintf(fp,"%*s shift        %-7d ** Parsing conflict **",
        indent,ap->sp->name,ap->x.stp->statenum);
      break;
    case SH_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s shift        %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.stp->statenum);
      }else{
        result = 0;
      }
      break;
    case RD_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s reduce %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.rp->iRule);
      }else{
        result = 0;
      }
      break;
    case NOT_USED:
      result = 0;
      break;
  }
  if( result && ap->spOpt ){
    fprintf(fp,"  /* because %s==%s */", ap->sp->name, ap->spOpt->name);
  }
  return result;
}